

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

void quest_chat(monst *mtmp)

{
  uchar uVar1;
  char *pcVar2;
  monst *mtmp_local;
  
  if (mtmp->m_id == quest_status.leader_m_id) {
    chat_with_leader();
  }
  else {
    uVar1 = mtmp->data->msound;
    if (uVar1 == ' ') {
      chat_with_nemesis();
    }
    else if (uVar1 == '!') {
      chat_with_guardian();
    }
    else {
      pcVar2 = mon_nam(mtmp);
      impossible("quest_chat: Unknown quest character %s.",pcVar2);
    }
  }
  return;
}

Assistant:

void quest_chat(struct monst *mtmp)
{
    if (mtmp->m_id == Qstat(leader_m_id)) {
	chat_with_leader();
	return;
    }
    switch(mtmp->data->msound) {
	    case MS_NEMESIS:	chat_with_nemesis(); break;
	    case MS_GUARDIAN:	chat_with_guardian(); break;
	    default:	impossible("quest_chat: Unknown quest character %s.",
				   mon_nam(mtmp));
	}
}